

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# notifier.hpp
# Opt level: O0

void __thiscall tf::Notifier::prepare_wait(Notifier *this,Waiter *w)

{
  uint64_t uVar1;
  Waiter *w_local;
  Notifier *this_local;
  
  LOCK();
  uVar1 = (this->_state).super___atomic_base<unsigned_long>._M_i;
  (this->_state).super___atomic_base<unsigned_long>._M_i =
       (this->_state).super___atomic_base<unsigned_long>._M_i + 0x10000;
  UNLOCK();
  w->epoch = uVar1;
  return;
}

Assistant:

void prepare_wait(Waiter* w) {
    w->epoch = _state.fetch_add(kWaiterInc, std::memory_order_relaxed);
    std::atomic_thread_fence(std::memory_order_seq_cst);
  }